

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall
QIconModeViewBase::dataChanged
          (QIconModeViewBase *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  QListView *pQVar4;
  QListViewPrivate *pQVar5;
  QAbstractItemModel *pQVar6;
  P _a;
  QSize QVar7;
  pointer pQVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  Representation RVar12;
  Representation RVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  QStyleOptionViewItem option;
  QModelIndex local_138;
  QModelIndex local_120;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar10 = ((this->super_QCommonListViewBase).dd)->column;
  if ((topLeft->c <= iVar10) && (iVar10 <= bottomRight->c)) {
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    pQVar4 = (this->super_QCommonListViewBase).qq;
    (**(code **)(*(long *)&(pQVar4->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(pQVar4,&local_108);
    lVar11 = (this->items).d.size;
    lVar9 = (long)bottomRight->r + 1;
    if (lVar11 < lVar9) {
      lVar9 = lVar11;
    }
    pQVar5 = (this->super_QCommonListViewBase).dd;
    uVar1 = (pQVar5->grid).ht.m_i;
    uVar2 = (pQVar5->grid).wd.m_i;
    iVar10 = topLeft->r;
    if (iVar10 < (int)lVar9) {
      lVar11 = (long)iVar10 * 0x14 + 10;
      lVar9 = lVar9 - iVar10;
      do {
        pQVar5 = (this->super_QCommonListViewBase).dd;
        pQVar6 = (pQVar5->super_QAbstractItemViewPrivate).model;
        iVar3 = pQVar5->column;
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_120,&(pQVar5->super_QAbstractItemViewPrivate).root);
        (**(code **)(*(long *)pQVar6 + 0x60))(&local_138,pQVar6,iVar10,iVar3,&local_120);
        QVar7 = QListViewPrivate::itemSize
                          ((this->super_QCommonListViewBase).dd,&local_108,&local_138);
        uVar14 = (ulong)QVar7 >> 0x20;
        RVar13 = QVar7.wd.m_i;
        if (-1 < (int)(uVar1 | uVar2)) {
          pQVar5 = (this->super_QCommonListViewBase).dd;
          RVar12.m_i = (pQVar5->grid).wd.m_i;
          if (RVar13.m_i <= RVar12.m_i) {
            RVar12.m_i = RVar13.m_i;
          }
          RVar13.m_i = (pQVar5->grid).ht.m_i;
          if (QVar7.ht.m_i.m_i <= RVar13.m_i) {
            RVar13.m_i = QVar7.ht.m_i.m_i;
          }
          uVar14 = (ulong)(uint)RVar13.m_i;
          RVar13.m_i = RVar12.m_i;
        }
        pQVar8 = QList<QListViewItem>::data(&this->items);
        if (0x7ffe < RVar13.m_i) {
          RVar13.m_i = 0x7fff;
        }
        *(short *)((long)pQVar8 + lVar11 + -2) = (short)RVar13.m_i;
        if (0x7ffe < (int)uVar14) {
          uVar14 = 0x7fff;
        }
        *(short *)((long)&pQVar8->x + lVar11) = (short)uVar14;
        lVar11 = lVar11 + 0x14;
        iVar10 = iVar10 + 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    QBrush::~QBrush(&local_108.backgroundBrush);
    if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&local_108.icon);
    QLocale::~QLocale(&local_108.locale);
    QFont::~QFont(&local_108.font);
    QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIconModeViewBase::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight)
{
    if (column() >= topLeft.column() && column() <= bottomRight.column())  {
        QStyleOptionViewItem option;
        initViewItemOption(&option);
        const int bottom = qMin(items.size(), bottomRight.row() + 1);
        const bool useItemSize = !dd->grid.isValid();
        for (int row = topLeft.row(); row < bottom; ++row)
        {
            QSize s = itemSize(option, modelIndex(row));
            if (!useItemSize)
            {
                s.setWidth(qMin(dd->grid.width(), s.width()));
                s.setHeight(qMin(dd->grid.height(), s.height()));
            }
            items[row].resize(s);
        }
    }
}